

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_date.cpp
# Opt level: O3

string * __thiscall
pstore::http::http_date_abi_cxx11_(string *__return_storage_ptr__,http *this,time_t time)

{
  char *__s;
  char *__s_00;
  long lVar1;
  size_t sVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  tm t;
  ostringstream fixdate;
  undefined7 in_stack_fffffffffffffe28;
  char in_stack_fffffffffffffe2f;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  uint local_1c0;
  int local_1bc;
  uint local_1b8;
  long local_198 [2];
  undefined8 auStack_188 [12];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  gm_time(CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  if ((int)local_1b8 < 1) {
    local_1b8 = 0;
  }
  uVar5 = 6;
  if ((int)local_1b8 < 6) {
    uVar5 = (ulong)local_1b8;
  }
  __s = http_date::days._M_elems[uVar5];
  uVar4 = 0;
  if (0 < (int)local_1c0) {
    uVar4 = local_1c0;
  }
  uVar5 = 0xb;
  if ((int)uVar4 < 0xb) {
    uVar5 = (ulong)uVar4;
  }
  __s_00 = http_date::months._M_elems[uVar5];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  lVar1 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar1 + 1] == '\0') {
    std::ios::widen((char)&stack0xfffffffffffffe28 + (char)lVar1 + '@');
    acStack_b8[lVar1 + 1] = '\x01';
  }
  acStack_b8[lVar1] = '0';
  if (__s == (char *)0x0) {
    std::ios::clear((int)&stack0xfffffffffffffe28 + (int)*(undefined8 *)(local_198[0] + -0x18) +
                    0x40);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,", ",2);
  *(undefined8 *)((long)auStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,local_1c4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&stack0xfffffffffffffe2f,1);
  if (__s_00 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar2 = strlen(__s_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s_00,sVar2);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&stack0xfffffffffffffe2f,1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,local_1bc + 0x76c);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&stack0xfffffffffffffe2f,1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,local_1c8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&stack0xfffffffffffffe2f,1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,local_1cc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&stack0xfffffffffffffe2f,1);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," GMT",4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string http_date (time_t const time) {
            std::tm const t = gm_time (time);

            // day-name = %x4D.6F.6E ; "Mon", case-sensitive
            //          / %x54.75.65 ; "Tue", case-sensitive
            //          / %x57.65.64 ; "Wed", case-sensitive
            //          / %x54.68.75 ; "Thu", case-sensitive
            //          / %x46.72.69 ; "Fri", case-sensitive
            //          / %x53.61.74 ; "Sat", case-sensitive
            //          / %x53.75.6E ; "Sun", case-sensitive
            static constexpr std::array<char const *, 7> days{
                {"Sun", "Mon", "Tue", "Wed", "Thu", "Fri", "Sat"}};
            auto const day_name = days[as_index (t.tm_wday, days.size ())];

            // month = %x4A.61.6E ; "Jan", case-sensitive
            //       / %x46.65.62 ; "Feb", case-sensitive
            //       / %x4D.61.72 ; "Mar", case-sensitive
            //       / %x41.70.72 ; "Apr", case-sensitive
            //       / %x4D.61.79 ; "May", case-sensitive
            //       / %x4A.75.6E ; "Jun", case-sensitive
            //       / %x4A.75.6C ; "Jul", case-sensitive
            //       / %x41.75.67 ; "Aug", case-sensitive
            //       / %x53.65.70 ; "Sep", case-sensitive
            //       / %x4F.63.74 ; "Oct", case-sensitive
            //       / %x4E.6F.76 ; "Nov", case-sensitive
            //       / %x44.65.63 ; "Dec", case-sensitive
            static constexpr std::array<char const *, 12> months{{"Jan", "Feb", "Mar", "Apr", "May",
                                                                  "Jun", "Jul", "Aug", "Sep", "Oct",
                                                                  "Nov", "Dec"}};
            auto const month = months[as_index (t.tm_mon, months.size ())];

            // hour         = 2DIGIT
            // minute       = 2DIGIT
            // second       = 2DIGIT
            // time-of-day  = hour ":" minute ":" second
            //              ; 00:00:00 - 23:59:60 (leap second)
            // year         = 4DIGIT
            // day          = 2DIGIT
            // date1        = day SP month SP year
            //              ; e.g., 02 Jun 1982
            // IMF-fixdate  = day-name "," SP date1 SP time-of-day SP GMT
            std::ostringstream fixdate;
            fixdate << std::setfill ('0') << day_name << ", " << std::setw (2) << t.tm_mday << ' '
                    << month << ' ' << std::setw (4) << t.tm_year + 1900 << ' ' << std::setw (2)
                    << t.tm_hour << ':' << std::setw (2) << t.tm_min << ':' << std::setw (2)
                    << t.tm_sec << " GMT";
            return fixdate.str ();
        }